

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

Am_Constraint * __thiscall Am_Web::operator_cast_to_Am_Constraint_(Am_Web *this)

{
  Am_Web_Validate_Proc *pAVar1;
  Am_Web_Initialize_Proc *pAVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x70);
  pAVar1 = this->validate;
  puVar3[0xb] = &PTR_ID_002e2860;
  puVar3[0xc] = puVar3;
  pAVar2 = this->initialize;
  *puVar3 = this->create;
  puVar3[1] = pAVar2;
  puVar3[2] = pAVar1;
  *(undefined1 *)((long)puVar3 + 0x6a) = 0;
  *(undefined2 *)(puVar3 + 0xd) = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  return (Am_Constraint *)(puVar3 + 0xb);
}

Assistant:

Am_Web::operator Am_Constraint *()
{
  Am_Web_Data *data = new Am_Web_Data(create, initialize, validate);
  return *data;
}